

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory.h
# Opt level: O0

void __thiscall
kj::_::HeapDisposer<capnp::compiler::Compiler::CompiledModule>::disposeImpl
          (HeapDisposer<capnp::compiler::Compiler::CompiledModule> *this,void *pointer)

{
  void *pointer_local;
  HeapDisposer<capnp::compiler::Compiler::CompiledModule> *this_local;
  
  if (pointer != (void *)0x0) {
    capnp::compiler::Compiler::CompiledModule::~CompiledModule((CompiledModule *)pointer);
    operator_delete(pointer,0x2e0);
  }
  return;
}

Assistant:

virtual void disposeImpl(void* pointer) const override { delete reinterpret_cast<T*>(pointer); }